

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O3

void fdb_file_handle_add_cmp_func
               (fdb_file_handle *fhandle,char *kvs_name,fdb_custom_cmp_variable cmp_func,
               void *cmp_func_user_param)

{
  list *list;
  undefined8 *puVar1;
  size_t sVar2;
  char *__dest;
  
  list = fhandle->cmp_func_list;
  if (list == (list *)0x0) {
    list = (list *)calloc(1,0x10);
    fhandle->cmp_func_list = list;
  }
  puVar1 = (undefined8 *)calloc(1,0x28);
  if (kvs_name == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar2 = strlen(kvs_name);
    __dest = (char *)calloc(1,sVar2 + 1);
    strcpy(__dest,kvs_name);
  }
  *puVar1 = __dest;
  puVar1[1] = cmp_func;
  puVar1[2] = cmp_func_user_param;
  list_push_back(list,(list_elem *)(puVar1 + 3));
  return;
}

Assistant:

void fdb_file_handle_add_cmp_func(fdb_file_handle* fhandle,
                                  char* kvs_name,
                                  fdb_custom_cmp_variable cmp_func,
                                  void* cmp_func_user_param)
{
    struct cmp_func_node *node;

    // create list if not exist
    if (!fhandle->cmp_func_list) {
        fhandle->cmp_func_list = (struct list*)calloc(1, sizeof(struct list));
        list_init(fhandle->cmp_func_list);
    }

    node = (struct cmp_func_node*)calloc(1, sizeof(struct cmp_func_node));
    if (kvs_name) {
        node->kvs_name = (char*)calloc(1, strlen(kvs_name)+1);
        strcpy(node->kvs_name, kvs_name);
    } else {
        // default KVS
        node->kvs_name = NULL;
    }
    node->func = cmp_func;
    node->user_param = cmp_func_user_param;
    list_push_back(fhandle->cmp_func_list, &node->le);
}